

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O1

Symbol finish_symop(Env *env,Symbol s)

{
  uint32_t uVar1;
  Symbol SVar2;
  
  if ((env->symbols[s] != false) || (SVar2 = FAIL, env->symbols[0x27] == true)) {
    if (env->symop == 0) {
      uVar1 = advance_while(env,0,symop_char);
      env->symop = uVar1;
    }
    SVar2 = left_section_op(env,env->symop);
    if (SVar2 == FAIL) {
      (*env->lexer->mark_end)(env->lexer);
      SVar2 = s;
    }
  }
  return SVar2;
}

Assistant:

static Symbol finish_symop(Env *env, Symbol s) {
  if (valid(env, s) || valid(env, LEFT_SECTION_OP)) {
    uint32_t after_symop = symop_lookahead(env);
    SEQ(left_section_op(env, after_symop));
    MARK("symop");
    return s;
  }
  return FAIL;
}